

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall Sintatico::corpo(Sintatico *this)

{
  bool bVar1;
  
  eat(this,0x22);
  while (((uint)this->tok < 0x18 && ((0x980000U >> (this->tok & 0x1fU) & 1) != 0))) {
    avancar(this);
  }
  do {
    comando(this);
    eat(this,0x15);
    bVar1 = Tokens::isEqual((Tokens *)this,this->tok,0x2b);
  } while (!bVar1);
  eat(this,0x2b);
  return;
}

Assistant:

void Sintatico::corpo() {
  eat(BEGIN);
  saltBlank();
  // cout << "deu bom\n";
  while(1) {
    comando();
    // cout << " to aqui na linha " << line << "\n";
    eat(PONTOVIRGULA);
    if(isEqual(tok, END))
      break;
  }
  eat(END);
}